

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool tinygltf::LoadExternalFile
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *err,string *warn,
               string *filename,string *basedir,bool required,size_t reqBytes,bool checkSize,
               FsCallbacks *fs)

{
  pointer puVar1;
  ExpandFilePathFunction p_Var2;
  undefined1 *puVar3;
  pointer puVar4;
  pointer puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *psVar7;
  bool bVar8;
  long *plVar9;
  undefined8 *puVar10;
  ostream *poVar11;
  size_type *psVar12;
  long lVar13;
  ulong uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string fileReadErr;
  stringstream ss;
  string local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_248;
  string *local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  if ((((fs == (FsCallbacks *)0x0) || (fs->FileExists == (FileExistsFunction)0x0)) ||
      (fs->ExpandFilePath == (ExpandFilePathFunction)0x0)) ||
     (fs->ReadWholeFile == (ReadWholeFileFunction)0x0)) {
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
    bVar8 = false;
  }
  else {
    if (required) {
      warn = err;
    }
    puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_248 = out;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_238,basedir);
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,".","");
    local_240 = warn;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_);
    }
    if (((fs->ExpandFilePath != (ExpandFilePathFunction)0x0) &&
        (fs->FileExists != (FileExistsFunction)0x0)) &&
       (local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        p_Var2 = fs->ExpandFilePath;
        JoinPath((string *)local_1b8,
                 (string *)
                 ((long)&((local_238.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13),
                 filename);
        (*p_Var2)(&local_2a8,(string *)local_1b8,fs->user_data);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_);
        }
        bVar8 = (*fs->FileExists)(&local_2a8,fs->user_data);
        if (bVar8) {
          if ((local_2a8._M_string_length == 0) || (filename->_M_string_length == 0))
          goto LAB_00289665;
          local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_218._M_string_length = 0;
          local_218.field_2._M_local_buf[0] = '\0';
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          bVar8 = (*fs->ReadWholeFile)(&local_288,&local_218,&local_2a8,fs->user_data);
          psVar7 = local_240;
          if (bVar8) {
            if (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              if (local_240 != (string *)0x0) {
                std::operator+(&local_268,"File is empty : ",&local_2a8);
                puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
                local_1b8._0_8_ = local_1b8 + 0x10;
                psVar12 = puVar10 + 2;
                if ((size_type *)*puVar10 == psVar12) {
                  local_1a8[0]._0_8_ = *psVar12;
                  local_1a8[0]._8_8_ = puVar10[3];
                }
                else {
                  local_1a8[0]._0_8_ = *psVar12;
                  local_1b8._0_8_ = (size_type *)*puVar10;
                }
                local_1b8._8_8_ = puVar10[1];
                *puVar10 = psVar12;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                std::__cxx11::string::_M_append((char *)psVar7,local_1b8._0_8_);
                if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
                  operator_delete((void *)local_1b8._0_8_);
                }
                pbVar6 = &local_268;
                goto LAB_00289b4b;
              }
              goto LAB_00289b59;
            }
            if ((checkSize) &&
               ((long)local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != reqBytes)) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),"File size mismatch : ",0x15);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_1b8 + 0x10),local_2a8._M_dataplus._M_p,
                                   local_2a8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", requestedBytes ",0x11);
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", but got ",10);
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
              std::endl<char,std::char_traits<char>>(poVar11);
              if (psVar7 != (string *)0x0) {
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_append((char *)psVar7,(ulong)local_268._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p);
                }
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
              goto LAB_00289b59;
            }
            puVar1 = (local_248->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            (local_248->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
            puVar4 = (local_248->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            puVar5 = (local_248->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            (local_248->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start =
                 local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
            (local_248->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish =
                 local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            bVar8 = true;
            local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = puVar4;
            local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar5;
            local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = puVar1;
          }
          else {
            if (local_240 != (string *)0x0) {
              std::operator+(&local_1d8,"File read error : ",&local_2a8);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d8);
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_1f8.field_2._M_allocated_capacity = *psVar12;
                local_1f8.field_2._8_8_ = plVar9[3];
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              }
              else {
                local_1f8.field_2._M_allocated_capacity = *psVar12;
                local_1f8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1f8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::operator+(&local_268,&local_1f8,&local_218);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
              local_1b8._0_8_ = local_1b8 + 0x10;
              psVar12 = puVar10 + 2;
              if ((size_type *)*puVar10 == psVar12) {
                local_1a8[0]._0_8_ = *psVar12;
                local_1a8[0]._8_8_ = puVar10[3];
              }
              else {
                local_1a8[0]._0_8_ = *psVar12;
                local_1b8._0_8_ = (size_type *)*puVar10;
              }
              local_1b8._8_8_ = puVar10[1];
              *puVar10 = psVar12;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)psVar7,local_1b8._0_8_);
              if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
                operator_delete((void *)local_1b8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                operator_delete(local_268._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p);
              }
              pbVar6 = &local_1d8;
LAB_00289b4b:
              puVar3 = *(undefined1 **)((pbVar6->field_2)._M_local_buf + -0x10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar3 != &pbVar6->field_2) {
                operator_delete(puVar3);
              }
            }
LAB_00289b59:
            bVar8 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p);
          }
          if (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_288.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_00289751;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x20;
      } while (uVar14 < (ulong)((long)local_238.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_238.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_local_buf[0] = '\0';
LAB_00289665:
    psVar7 = local_240;
    if (local_240 != (string *)0x0) {
      std::operator+(&local_218,"File not found : ",filename);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_218);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar12) {
        local_1a8[0]._0_8_ = *psVar12;
        local_1a8[0]._8_8_ = plVar9[3];
        local_1b8._0_8_ = local_1b8 + 0x10;
      }
      else {
        local_1a8[0]._0_8_ = *psVar12;
        local_1b8._0_8_ = (size_type *)*plVar9;
      }
      local_1b8._8_8_ = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)psVar7,local_1b8._0_8_);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
    }
    bVar8 = false;
LAB_00289751:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_238);
  }
  return bVar8;
}

Assistant:

static bool LoadExternalFile(std::vector<unsigned char> *out, std::string *err,
                             std::string *warn, const std::string &filename,
                             const std::string &basedir, bool required,
                             size_t reqBytes, bool checkSize, FsCallbacks *fs) {
  if (fs == nullptr || fs->FileExists == nullptr ||
      fs->ExpandFilePath == nullptr || fs->ReadWholeFile == nullptr) {
    // This is a developer error, assert() ?
    if (err) {
      (*err) += "FS callback[s] not set\n";
    }
    return false;
  }

  std::string *failMsgOut = required ? err : warn;

  out->clear();

  std::vector<std::string> paths;
  paths.push_back(basedir);
  paths.push_back(".");

  std::string filepath = FindFile(paths, filename, fs);
  if (filepath.empty() || filename.empty()) {
    if (failMsgOut) {
      (*failMsgOut) += "File not found : " + filename + "\n";
    }
    return false;
  }

  std::vector<unsigned char> buf;
  std::string fileReadErr;
  bool fileRead =
      fs->ReadWholeFile(&buf, &fileReadErr, filepath, fs->user_data);
  if (!fileRead) {
    if (failMsgOut) {
      (*failMsgOut) +=
          "File read error : " + filepath + " : " + fileReadErr + "\n";
    }
    return false;
  }

  size_t sz = buf.size();
  if (sz == 0) {
    if (failMsgOut) {
      (*failMsgOut) += "File is empty : " + filepath + "\n";
    }
    return false;
  }

  if (checkSize) {
    if (reqBytes == sz) {
      out->swap(buf);
      return true;
    } else {
      std::stringstream ss;
      ss << "File size mismatch : " << filepath << ", requestedBytes "
         << reqBytes << ", but got " << sz << std::endl;
      if (failMsgOut) {
        (*failMsgOut) += ss.str();
      }
      return false;
    }
  }

  out->swap(buf);
  return true;
}